

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall UtestShellPointerArray::shuffle(UtestShellPointerArray *this,size_t seed)

{
  ulong uVar1;
  int iVar2;
  size_t j;
  size_t i;
  size_t seed_local;
  UtestShellPointerArray *this_local;
  
  if (this->count_ != 0) {
    (*PlatformSpecificSrand)((uint)seed);
    uVar1 = this->count_;
    while (j = uVar1 - 1, j != 0) {
      if (this->count_ == 0) {
        return;
      }
      iVar2 = (*PlatformSpecificRand)();
      swap(this,j,(ulong)(long)iVar2 % uVar1);
      uVar1 = j;
    }
    relinkTestsInOrder(this);
  }
  return;
}

Assistant:

void UtestShellPointerArray::shuffle(size_t seed)
{
    if (count_ == 0) return;

    PlatformSpecificSrand((unsigned int) seed);

    for (size_t i = count_ - 1; i >= 1; --i)
    {
        if (count_ == 0) return;

        const size_t j = ((size_t)PlatformSpecificRand()) % (i + 1); // distribution biased by modulo, but good enough for shuffling
        swap(i, j);
   }
   relinkTestsInOrder();
}